

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::input(Extractor *this,int blob_index,Mat *in)

{
  int iVar1;
  int *piVar2;
  size_type sVar3;
  reference pvVar4;
  reference in_RDX;
  int in_ESI;
  long in_RDI;
  int local_3c;
  
  if ((in_ESI < 0) ||
     (sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                         (*(long *)(in_RDI + 8) + 8)), (int)sVar3 <= in_ESI)) {
    local_3c = -1;
  }
  else {
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(*(long *)(in_RDI + 8) + 8)
                        ,(long)in_ESI);
    if (pvVar4 != in_RDX) {
      if (in_RDX->refcount != (int *)0x0) {
        LOCK();
        *in_RDX->refcount = *in_RDX->refcount + 1;
        UNLOCK();
      }
      if (pvVar4->refcount != (int *)0x0) {
        piVar2 = pvVar4->refcount;
        LOCK();
        iVar1 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (pvVar4->allocator == (Allocator *)0x0) {
            if (pvVar4->data != (void *)0x0) {
              free(pvVar4->data);
            }
          }
          else {
            (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
          }
        }
      }
      pvVar4->data = (void *)0x0;
      pvVar4->elemsize = 0;
      pvVar4->elempack = 0;
      pvVar4->dims = 0;
      pvVar4->w = 0;
      pvVar4->h = 0;
      pvVar4->d = 0;
      pvVar4->c = 0;
      pvVar4->cstep = 0;
      pvVar4->refcount = (int *)0x0;
      pvVar4->data = in_RDX->data;
      pvVar4->refcount = in_RDX->refcount;
      pvVar4->elemsize = in_RDX->elemsize;
      pvVar4->elempack = in_RDX->elempack;
      pvVar4->allocator = in_RDX->allocator;
      pvVar4->dims = in_RDX->dims;
      pvVar4->w = in_RDX->w;
      pvVar4->h = in_RDX->h;
      pvVar4->d = in_RDX->d;
      pvVar4->c = in_RDX->c;
      pvVar4->cstep = in_RDX->cstep;
    }
    local_3c = 0;
  }
  return local_3c;
}

Assistant:

int Extractor::input(int blob_index, const Mat& in)
{
    if (blob_index < 0 || blob_index >= (int)d->blob_mats.size())
        return -1;

    d->blob_mats[blob_index] = in;

    return 0;
}